

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

TrackSet<ASDCP::MXF::TimecodeComponent> * __thiscall
ASDCP::MXF::CreateTrackAndSequence<ASDCP::MXF::SourcePackage,ASDCP::MXF::TimecodeComponent>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,MXF *this,
          OP1aHeader *Header,SourcePackage *Package,string *TrackName,Rational *clip_edit_rate,
          UL *Definition,ui32_t TrackID,Dictionary *Dict)

{
  Track *this_00;
  char *sz;
  Sequence *this_01;
  undefined4 in_stack_00000014;
  UTF16String local_68;
  Rational *local_30;
  UL *Definition_local;
  Rational *clip_edit_rate_local;
  string *TrackName_local;
  SourcePackage *Package_local;
  OP1aHeader *Header_local;
  
  local_30 = clip_edit_rate;
  Definition_local = (UL *)TrackName;
  clip_edit_rate_local = (Rational *)Package;
  TrackName_local = (string *)Header;
  Package_local = (SourcePackage *)this;
  TrackSet<ASDCP::MXF::TimecodeComponent>::TrackSet(__return_storage_ptr__);
  this_00 = (Track *)operator_new(0x118);
  Track::Track(this_00,(Dictionary *)CONCAT44(in_stack_00000014,TrackID));
  __return_storage_ptr__->Track = this_00;
  (*(Package_local->super_GenericPackage).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
    [0xd])(Package_local,__return_storage_ptr__->Track);
  Rational::operator=(&__return_storage_ptr__->Track->EditRate,(Rational *)Definition_local);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
             ((long)&TrackName_local[9].field_2 + 8),
             &(__return_storage_ptr__->Track->super_GenericTrack).super_InterchangeObject.
              InstanceUID);
  (__return_storage_ptr__->Track->super_GenericTrack).TrackID = (ui32_t)Definition;
  sz = (char *)std::__cxx11::string::c_str();
  UTF16String::UTF16String(&local_68,sz);
  optional_property<ASDCP::MXF::UTF16String>::operator=
            (&(__return_storage_ptr__->Track->super_GenericTrack).TrackName,&local_68);
  UTF16String::~UTF16String(&local_68);
  this_01 = (Sequence *)operator_new(0xf0);
  Sequence::Sequence(this_01,(Dictionary *)CONCAT44(in_stack_00000014,TrackID));
  __return_storage_ptr__->Sequence = this_01;
  (*(Package_local->super_GenericPackage).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
    [0xd])(Package_local,__return_storage_ptr__->Sequence);
  optional_property<Kumu::UUID>::operator=
            (&(__return_storage_ptr__->Track->super_GenericTrack).Sequence,
             &(__return_storage_ptr__->Sequence->super_StructuralComponent).super_InterchangeObject.
              InstanceUID);
  UL::operator=(&(__return_storage_ptr__->Sequence->super_StructuralComponent).DataDefinition,
                (UL *)local_30);
  return __return_storage_ptr__;
}

Assistant:

TrackSet<ClipT>
	CreateTrackAndSequence(OP1aHeader& Header, PackageT& Package, const std::string TrackName,
			       const MXF::Rational& clip_edit_rate, const UL& Definition, ui32_t TrackID, const Dictionary *Dict)
	{
	  TrackSet<ClipT> NewTrack;

	  NewTrack.Track = new Track(Dict);
	  Header.AddChildObject(NewTrack.Track);
	  NewTrack.Track->EditRate = clip_edit_rate;
	  Package.Tracks.push_back(NewTrack.Track->InstanceUID);
	  NewTrack.Track->TrackID = TrackID;
	  NewTrack.Track->TrackName = TrackName.c_str();

	  NewTrack.Sequence = new Sequence(Dict);
	  Header.AddChildObject(NewTrack.Sequence);
	  NewTrack.Track->Sequence = NewTrack.Sequence->InstanceUID;
	  NewTrack.Sequence->DataDefinition = Definition;

	  return NewTrack;
	}